

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void Abc_NtkDumpOneCex(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex,int fPrintFull,int fNames,
                      int fUseFfNames,int fMinimize,int fUseOldMin,int fCheckCex,int fUseSatBased,
                      int fHighEffort,int fAiger,int fVerbose)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Abc_Cex_t *p;
  Aig_Man_t *p_00;
  Abc_Obj_t *pAVar6;
  void *__s;
  char *pcVar7;
  int local_74;
  int local_70;
  int iPivotPi;
  int iFlop;
  int nXValues;
  int *pValues;
  Aig_Man_t *pAig_1;
  Abc_Cex_t *pCare;
  Abc_Cex_t *pCexFull;
  Aig_Man_t *pAig;
  int f;
  int i;
  Abc_Obj_t *pObj;
  int local_28;
  int fUseFfNames_local;
  int fNames_local;
  int fPrintFull_local;
  Abc_Cex_t *pCex_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  pObj._4_4_ = fUseFfNames;
  local_28 = fNames;
  fUseFfNames_local = fPrintFull;
  _fNames_local = pCex;
  pCex_local = (Abc_Cex_t *)pNtk;
  pNtk_local = (Abc_Ntk_t *)pFile;
  if (fPrintFull == 0) {
    if (fNames == 0) {
      fUseFfNames_local = 0;
      local_28 = 0;
      for (pAig._4_4_ = 0; iVar4 = pAig._4_4_, iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(pCex_local + 4)),
          iVar4 < iVar3; pAig._4_4_ = pAig._4_4_ + 1) {
        _f = Abc_NtkBox((Abc_Ntk_t *)pCex_local,pAig._4_4_);
        iVar4 = Abc_ObjIsLatch(_f);
        pAVar2 = pNtk_local;
        if (iVar4 != 0) {
          iVar4 = Abc_LatchIsInit0(_f);
          fprintf((FILE *)pAVar2,"%c",(ulong)(((iVar4 != 0 ^ 0xffU) & 1) + 0x30));
        }
      }
      for (pAig._4_4_ = _fNames_local->nRegs; pAig._4_4_ < _fNames_local->nBits;
          pAig._4_4_ = pAig._4_4_ + 1) {
        if ((fAiger != 0) && ((pAig._4_4_ - _fNames_local->nRegs) % _fNames_local->nPis == 0)) {
          fprintf((FILE *)pNtk_local,"\n");
        }
        pAVar2 = pNtk_local;
        iVar4 = Abc_InfoHasBit((uint *)(_fNames_local + 1),pAig._4_4_);
        fprintf((FILE *)pAVar2,"%c",(ulong)(iVar4 + 0x30));
      }
    }
    else {
      pAig_1 = (Aig_Man_t *)0x0;
      if (fMinimize == 0) {
        fprintf((FILE *)pFile,"# FALSIFYING OUTPUTS:");
        pAVar2 = pNtk_local;
        pAVar6 = Abc_NtkCo((Abc_Ntk_t *)pCex_local,_fNames_local->iPo);
        pcVar5 = Abc_ObjName(pAVar6);
        fprintf((FILE *)pAVar2," %s",pcVar5);
      }
      else {
        p_00 = Abc_NtkToDar(pNtk,0,1);
        fprintf((FILE *)pNtk_local,"# FALSIFYING OUTPUTS:");
        pAVar2 = pNtk_local;
        pAVar6 = Abc_NtkCo((Abc_Ntk_t *)pCex_local,_fNames_local->iPo);
        pcVar5 = Abc_ObjName(pAVar6);
        fprintf((FILE *)pAVar2," %s",pcVar5);
        if (fUseOldMin == 0) {
          if (fUseSatBased == 0) {
            iVar4 = Saig_ManPiNum(p_00);
            pAig_1 = (Aig_Man_t *)Bmc_CexCareMinimize(p_00,iVar4,_fNames_local,4,fCheckCex,fVerbose)
            ;
          }
          else {
            iVar4 = Saig_ManPiNum(p_00);
            pAig_1 = (Aig_Man_t *)
                     Bmc_CexCareSatBasedMinimize
                               (p_00,iVar4,_fNames_local,fHighEffort,fCheckCex,fVerbose);
          }
        }
        else {
          pAig_1 = (Aig_Man_t *)Saig_ManCbaFindCexCareBits(p_00,_fNames_local,0,fVerbose);
          if (fCheckCex != 0) {
            Bmc_CexCareVerify(p_00,_fNames_local,(Abc_Cex_t *)pAig_1,fVerbose);
          }
        }
        Aig_ManStop(p_00);
        if (pAig_1 == (Aig_Man_t *)0x0) {
          printf("Counter-example minimization has failed.\n");
        }
      }
      fprintf((FILE *)pNtk_local,"\n");
      fprintf((FILE *)pNtk_local,"# COUNTEREXAMPLE LENGTH: %u\n",(ulong)(_fNames_local->iFrame + 1))
      ;
      if ((pObj._4_4_ == 0) || (iVar4 = Abc_NtkCheckSpecialPi((Abc_Ntk_t *)pCex_local), iVar4 == 0))
      {
        for (pAig._4_4_ = 0; iVar4 = pAig._4_4_,
            iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(pCex_local + 4)), iVar4 < iVar3;
            pAig._4_4_ = pAig._4_4_ + 1) {
          _f = Abc_NtkBox((Abc_Ntk_t *)pCex_local,pAig._4_4_);
          iVar4 = Abc_ObjIsLatch(_f);
          pAVar2 = pNtk_local;
          if (iVar4 != 0) {
            pAVar6 = Abc_ObjFanout0(_f);
            pcVar5 = Abc_ObjName(pAVar6);
            iVar4 = Abc_LatchIsInit0(_f);
            fprintf((FILE *)pAVar2,"%s@0=%c\n",pcVar5,(ulong)(((iVar4 != 0 ^ 0xffU) & 1) + 0x30));
          }
        }
        for (pAig._0_4_ = 0; (int)(uint)pAig <= _fNames_local->iFrame; pAig._0_4_ = (uint)pAig + 1)
        {
          for (pAig._4_4_ = 0; iVar4 = pAig._4_4_, iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local),
              iVar4 < iVar3; pAig._4_4_ = pAig._4_4_ + 1) {
            _f = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
            if ((pAig_1 == (Aig_Man_t *)0x0) ||
               (iVar4 = Abc_InfoHasBit((uint *)((long)&pAig_1->vCis + 4),
                                       *(int *)&pAig_1->pSpec +
                                       *(int *)((long)&pAig_1->pSpec + 4) * (uint)pAig + pAig._4_4_)
               , iVar4 != 0)) {
              pAVar2 = pNtk_local;
              pcVar5 = Abc_ObjName(_f);
              uVar1 = (uint)pAig;
              iVar4 = Abc_InfoHasBit((uint *)(_fNames_local + 1),
                                     _fNames_local->nRegs + _fNames_local->nPis * (uint)pAig +
                                     pAig._4_4_);
              fprintf((FILE *)pAVar2,"%s@%d=%c\n",pcVar5,(ulong)uVar1,(ulong)(iVar4 + 0x30));
            }
          }
        }
      }
      else {
        iPivotPi = 0;
        local_70 = 0;
        for (local_74 = 0; iVar4 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local), local_74 < iVar4;
            local_74 = local_74 + 1) {
          _f = Abc_NtkPi((Abc_Ntk_t *)pCex_local,local_74);
          pcVar5 = Abc_ObjName(_f);
          iVar4 = strcmp(pcVar5,"_abc_190121_abc_");
          if (iVar4 == 0) break;
        }
        iVar4 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local);
        pAig._4_4_ = local_74;
        if (local_74 == iVar4) {
          fprintf(_stdout,"IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n"
                 );
          return;
        }
        while( true ) {
          pAig._4_4_ = pAig._4_4_ + 1;
          iVar4 = pAig._4_4_;
          iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local);
          if (iVar3 <= iVar4) break;
          pAVar6 = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
          pcVar5 = Abc_ObjName(pAVar6);
          if (*pcVar5 == 'x') {
            iPivotPi = iPivotPi + 1;
          }
        }
        iVar4 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local);
        __s = malloc((long)iVar4 << 2);
        iVar4 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local);
        memset(__s,0xff,(long)iVar4 << 2);
        pAig._4_4_ = local_74;
        while( true ) {
          pAig._4_4_ = pAig._4_4_ + 1;
          iVar4 = pAig._4_4_;
          iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local);
          if (iVar3 <= iVar4) break;
          pAVar6 = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
          pcVar5 = Abc_ObjName(pAVar6);
          if (*pcVar5 == 'x') {
            *(int *)((long)__s + (long)pAig._4_4_ * 4) = (local_74 - iPivotPi) + local_70;
            local_70 = local_70 + 1;
          }
        }
        iVar4 = local_74;
        if (local_70 != iPivotPi) {
          __assert_fail("iFlop == nXValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                        ,0x9d2,
                        "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                       );
        }
        while( true ) {
          pAig._4_4_ = iVar4 + 1;
          iVar4 = pAig._4_4_;
          iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local);
          pAVar2 = pNtk_local;
          if (iVar3 <= iVar4) break;
          if (*(int *)((long)__s + (long)pAig._4_4_ * 4) == -1) {
            pAVar6 = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
            pcVar5 = Abc_ObjName(pAVar6);
            pAVar6 = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
            pcVar7 = Abc_ObjName(pAVar6);
            fprintf((FILE *)pAVar2,"%s@0=%c\n",pcVar5 + 1,(ulong)(uint)(int)*pcVar7);
            iVar4 = pAig._4_4_;
          }
          else {
            iVar3 = Abc_InfoHasBit((uint *)((long)&pAig_1->vCis + 4),
                                   *(int *)&pAig_1->pSpec +
                                   *(int *)((long)__s + (long)pAig._4_4_ * 4));
            pAVar2 = pNtk_local;
            iVar4 = pAig._4_4_;
            if (iVar3 != 0) {
              pAVar6 = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
              pcVar5 = Abc_ObjName(pAVar6);
              iVar4 = Abc_InfoHasBit((uint *)(_fNames_local + 1),
                                     _fNames_local->nRegs +
                                     *(int *)((long)__s + (long)pAig._4_4_ * 4));
              fprintf((FILE *)pAVar2,"%s@0=%c\n",pcVar5 + 1,(ulong)(iVar4 + 0x30));
              iVar4 = pAig._4_4_;
            }
          }
        }
        if (__s != (void *)0x0) {
          free(__s);
        }
        for (pAig._0_4_ = 0; (int)(uint)pAig <= _fNames_local->iFrame; pAig._0_4_ = (uint)pAig + 1)
        {
          pAig._4_4_ = 0;
          while ((iVar4 = pAig._4_4_, iVar3 = Abc_NtkPiNum((Abc_Ntk_t *)pCex_local), iVar4 < iVar3
                 && (_f = Abc_NtkPi((Abc_Ntk_t *)pCex_local,pAig._4_4_),
                    pAig._4_4_ != local_74 - iPivotPi))) {
            if ((pAig_1 == (Aig_Man_t *)0x0) ||
               (iVar4 = Abc_InfoHasBit((uint *)((long)&pAig_1->vCis + 4),
                                       *(int *)&pAig_1->pSpec +
                                       *(int *)((long)&pAig_1->pSpec + 4) * (uint)pAig + pAig._4_4_)
               , iVar4 != 0)) {
              pAVar2 = pNtk_local;
              pcVar5 = Abc_ObjName(_f);
              uVar1 = (uint)pAig;
              iVar4 = Abc_InfoHasBit((uint *)(_fNames_local + 1),
                                     _fNames_local->nRegs + _fNames_local->nPis * (uint)pAig +
                                     pAig._4_4_);
              fprintf((FILE *)pAVar2,"%s@%d=%c\n",pcVar5,(ulong)uVar1,(ulong)(iVar4 + 0x30));
            }
            pAig._4_4_ = pAig._4_4_ + 1;
          }
        }
      }
      Abc_CexFreeP((Abc_Cex_t **)&pAig_1);
    }
  }
  else {
    pCexFull = (Abc_Cex_t *)Abc_NtkToDar(pNtk,0,1);
    pCare = Saig_ManExtendCex((Aig_Man_t *)pCexFull,_fNames_local);
    Aig_ManStop((Aig_Man_t *)pCexFull);
    iVar4 = pCare->nBits;
    iVar3 = Abc_NtkCiNum((Abc_Ntk_t *)pCex_local);
    if (iVar4 != iVar3 * (_fNames_local->iFrame + 1)) {
      __assert_fail("pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                    ,0x999,
                    "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    for (pAig._0_4_ = 0; (int)(uint)pAig <= _fNames_local->iFrame; pAig._0_4_ = (uint)pAig + 1) {
      for (pAig._4_4_ = 0; iVar4 = pAig._4_4_, iVar3 = Abc_NtkCiNum((Abc_Ntk_t *)pCex_local),
          iVar4 < iVar3; pAig._4_4_ = pAig._4_4_ + 1) {
        _f = Abc_NtkCi((Abc_Ntk_t *)pCex_local,pAig._4_4_);
        pAVar2 = pNtk_local;
        pcVar5 = Abc_ObjName(_f);
        uVar1 = (uint)pAig;
        p = pCare + 1;
        iVar4 = Abc_NtkCiNum((Abc_Ntk_t *)pCex_local);
        iVar4 = Abc_InfoHasBit((uint *)p,iVar4 * (uint)pAig + pAig._4_4_);
        fprintf((FILE *)pAVar2,"%s@%d=%c ",pcVar5,(ulong)uVar1,(ulong)(iVar4 + 0x30));
      }
    }
    Abc_CexFreeP(&pCare);
  }
  return;
}

Assistant:

void Abc_NtkDumpOneCex( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex, 
    int fPrintFull, int fNames, int fUseFfNames, int fMinimize, int fUseOldMin, 
    int fCheckCex, int fUseSatBased, int fHighEffort, int fAiger, int fVerbose )
{
    Abc_Obj_t * pObj;
    int i, f;
    if ( fPrintFull )
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Abc_Cex_t * pCexFull = Saig_ManExtendCex( pAig, pCex );
        Aig_ManStop( pAig );
        // output PI values (while skipping the minimized ones)
        assert( pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            Abc_NtkForEachCi( pNtk, pObj, i )
                fprintf( pFile, "%s@%d=%c ", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCexFull->pData, Abc_NtkCiNum(pNtk)*f + i) );
        Abc_CexFreeP( &pCexFull );
    }
    else if ( fNames )
    {
        Abc_Cex_t * pCare = NULL;
        if ( fMinimize )
        {
            extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
            Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
            if ( fUseOldMin )
            {
                pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, 0, fVerbose );
                if ( fCheckCex )
                    Bmc_CexCareVerify( pAig, pCex, pCare, fVerbose );
            }
            else if ( fUseSatBased )
                pCare = Bmc_CexCareSatBasedMinimize( pAig, Saig_ManPiNum(pAig), pCex, fHighEffort, fCheckCex, fVerbose );
            else
                pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, fCheckCex, fVerbose );
            Aig_ManStop( pAig );
            if(pCare == NULL)                                           
                printf( "Counter-example minimization has failed.\n" ); 
        }
        else
        {
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                        
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) );
        }
        fprintf( pFile, "\n");                                           
        fprintf( pFile, "# COUNTEREXAMPLE LENGTH: %u\n", pCex->iFrame+1);
        if ( fUseFfNames && Abc_NtkCheckSpecialPi(pNtk) )
        {
            int * pValues;
            int nXValues = 0, iFlop = 0, iPivotPi = -1;
            Abc_NtkForEachPi( pNtk, pObj, iPivotPi )
                if ( !strcmp(Abc_ObjName(pObj), "_abc_190121_abc_") )
                    break;
            if ( iPivotPi == Abc_NtkPiNum(pNtk) )
            {
                fprintf( stdout, "IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n" );
                return;
            }
            // count X-valued flops
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    nXValues++;
            // map X-valued flops into auxiliary PIs
            pValues = ABC_FALLOC( int, Abc_NtkPiNum(pNtk) );
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    pValues[i] = iPivotPi - nXValues + iFlop++;
            assert( iFlop == nXValues );
            // write flop values
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( pValues[i] == -1 )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, Abc_ObjName(Abc_NtkPi(pNtk, i))[0] );
                else if ( Abc_InfoHasBit(pCare->pData, pCare->nRegs + pValues[i]) )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs + pValues[i]) );
            ABC_FREE( pValues );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                {
                    if ( i == iPivotPi - nXValues ) break;
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
                }
        }
        else
        {
            // output flop values (unaffected by the minimization)
            Abc_NtkForEachLatch( pNtk, pObj, i )
                fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
        }
        Abc_CexFreeP( &pCare );
    }
    else
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "%c", '0'+!Abc_LatchIsInit0(pObj) );

        for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        {
            if ( fAiger && (i-pCex->nRegs)%pCex->nPis == 0)
                fprintf( pFile, "\n");
            fprintf( pFile, "%c", '0'+Abc_InfoHasBit(pCex->pData, i) );
        }
    }
}